

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  AuxArray<unsigned_int> *pAVar1;
  uint local_34;
  uint i;
  AuxArray<unsigned_int> *arr;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data_local;
  OpCode op_local;
  
  DumpCallI<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
            (op,data,dumpFunction,reader);
  if ((data->Options & CallIExtended_SpreadArgs) != CallIExtended_None) {
    pAVar1 = ByteCodeReader::ReadAuxArray<unsigned_int>(data->SpreadAuxOffset,dumpFunction);
    Output::Print(L" spreadArgs [",(ulong)pAVar1->count);
    for (local_34 = 0; local_34 < pAVar1->count; local_34 = local_34 + 1) {
      if (10 < local_34) {
        Output::Print(L", ...");
        break;
      }
      if (local_34 != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%u",(ulong)pAVar1[(ulong)local_34 + 1].count);
    }
    Output::Print(L"]");
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpCallIExtended(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpCallI(op, data, dumpFunction, reader);
        if (data->Options & Js::CallIExtended_SpreadArgs)
        {
            const Js::AuxArray<uint32> *arr = reader.ReadAuxArray<uint32>(data->SpreadAuxOffset, dumpFunction);
            Output::Print(_u(" spreadArgs ["), arr->count);
            for (uint i = 0; i < arr->count; i++)
            {
                if (i > 10)
                {
                    Output::Print(_u(", ..."));
                    break;
                }
                if (i != 0)
                {
                    Output::Print(_u(", "));
                }
                Output::Print(_u("%u"), arr->elements[i]);
            }
            Output::Print(_u("]"));
        }
    }